

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::CmdLine(CmdLine *this,CmdLineOpts opt)

{
  undefined4 in_ESI;
  API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
  *in_RDI;
  undefined **this_00;
  
  this_00 = &PTR__CmdLine_001bd578;
  in_RDI->_vptr_API = (_func_int **)&PTR__CmdLine_001bd578;
  details::
  API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
  ::API(in_RDI,(CmdLine *)in_RDI,(CmdLine *)in_RDI);
  in_RDI->_vptr_API = (_func_int **)this_00;
  Context::Context((Context *)this_00);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::vector((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
            *)0x171d67);
  in_RDI[3].m_parent = (CmdLine *)0x0;
  in_RDI[3].m_self = (CmdLine *)0x0;
  std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::vector
            ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)0x171d85);
  *(undefined4 *)&in_RDI[5]._vptr_API = in_ESI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x171d9d);
  std::__cxx11::string::string((string *)&in_RDI[6].m_parent);
  return;
}

Assistant:

explicit CmdLine( CmdLineOpts opt = Empty )
		:	details::API< CmdLine, CmdLine, ArgPtr, true > ( *this, *this )
		,	m_command( nullptr )
		,	m_currCommand( nullptr )
		,	m_opt( opt )
	{
	}